

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::torrent::move_storage(torrent *this,string *save_path,move_flags_t flags)

{
  int *piVar1;
  _func_int **pp_Var2;
  byte bVar3;
  uint uVar4;
  pointer pcVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  string *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  string_view f;
  string path;
  operation_t local_a9;
  undefined1 local_a8 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  session_interface *local_78;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> local_70;
  undefined1 local_68 [16];
  undefined8 *local_58;
  __uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
  _Stack_50;
  code *local_48;
  code *apcStack_40 [2];
  
  if (((this->super_torrent_hot_members).field_0x4b & 4) == 0) {
    if ((((this->super_torrent_hot_members).m_torrent_file.
          super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_files)
        .m_piece_length < 1) {
      iVar8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      if ((*(uint *)(CONCAT44(extraout_var_02,iVar8) + 0x68) & 8) != 0) {
        iVar8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[5])();
        get_handle((torrent *)local_a8);
        in_RCX = &this->m_save_path;
        alert_manager::
        emplace_alert<libtorrent::storage_moved_alert,libtorrent::torrent_handle,std::__cxx11::string_const&,std::__cxx11::string&>
                  ((alert_manager *)CONCAT44(extraout_var_03,iVar8),(torrent_handle *)local_a8,
                   save_path,in_RCX);
        if ((_Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>)local_a8._8_8_ !=
            (_Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            piVar1 = (int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_a8._8_8_)->
                                    super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                    ).
                                    super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + 4);
            iVar8 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
          }
          else {
            iVar8 = *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_a8._8_8_)->
                                    super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                    ).
                                    super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + 4);
            in_RCX = (string *)(ulong)(iVar8 - 1U);
            *(uint *)((long)&(((vector<piece_pos,_piece_index_t> *)local_a8._8_8_)->
                             super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                             ).
                             super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar8 - 1U;
          }
          if (iVar8 == 1) {
            (*(code *)(((vector<piece_pos,_piece_index_t> *)local_a8._8_8_)->
                      super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                      ).
                      super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                      ._M_impl.super__Vector_impl_data._M_start[3])();
          }
        }
      }
      f._M_str = (char *)in_RCX;
      f._M_len = (size_t)(save_path->_M_dataplus)._M_p;
      complete_abi_cxx11_((string *)local_a8,(libtorrent *)save_path->_M_string_length,f);
      ::std::__cxx11::string::operator=((string *)&this->m_save_path,(string *)local_a8);
      if ((undefined1 *)local_a8._0_8_ == local_a8 + 0x10) {
        return;
      }
    }
    else {
      if ((this->m_storage).m_disk_io == (disk_interface *)0x0) {
        iVar8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[5])();
        if ((*(uint *)(CONCAT44(extraout_var_04,iVar8) + 0x68) & 8) != 0) {
          iVar8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                    _vptr_session_logger[5])();
          get_handle((torrent *)local_a8);
          alert_manager::
          emplace_alert<libtorrent::storage_moved_alert,libtorrent::torrent_handle,std::__cxx11::string_const&,std::__cxx11::string&>
                    ((alert_manager *)CONCAT44(extraout_var_05,iVar8),(torrent_handle *)local_a8,
                     save_path,&this->m_save_path);
          if ((piece_picker *)local_a8._8_8_ != (piece_picker *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              piVar1 = (int *)(local_a8._8_8_ + 0xc);
              iVar8 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
            }
            else {
              iVar8 = *(int *)(local_a8._8_8_ + 0xc);
              *(int *)(local_a8._8_8_ + 0xc) = iVar8 + -1;
            }
            if (iVar8 == 1) {
              (**(code **)(*(long *)local_a8._8_8_ + 0x18))();
            }
          }
        }
        ::std::__cxx11::string::_M_assign((string *)&this->m_save_path);
        bVar3 = (this->m_need_save_resume_data).m_val;
        if ((bVar3 & 0x20) != 0) {
          return;
        }
        (this->m_need_save_resume_data).m_val = bVar3 | 0x20;
        state_updated(this);
        return;
      }
      pp_Var2 = (_func_int **)(local_a8 + 0x10);
      pcVar5 = (save_path->_M_dataplus)._M_p;
      local_a8._0_8_ = pp_Var2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_a8,pcVar5,pcVar5 + save_path->_M_string_length);
      iVar8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[4])();
      uVar4 = (this->m_storage).m_idx.m_val;
      local_78 = (session_interface *)local_68;
      if ((_func_int **)local_a8._0_8_ == pp_Var2) {
        local_68._8_8_ = local_a8._24_8_;
      }
      else {
        local_78 = (session_interface *)local_a8._0_8_;
      }
      local_68._1_7_ = local_a8._17_7_;
      local_68[0] = local_a8[0x10];
      local_70._M_head_impl = (piece_picker *)local_a8._8_8_;
      local_a8._8_8_ =
           (__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
            )0x0;
      local_a8[0x10] = '\0';
      local_a8._0_8_ = pp_Var2;
      ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libtorrent::aux::torrent,void>
                ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&local_88,
                 (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
      p_Var7 = p_Stack_80;
      _Var6._M_pi = local_88._M_pi;
      local_88._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_58 = (undefined8 *)0x0;
      _Stack_50._M_t.
      super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
      .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl =
           (tuple<libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>)
           (_Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
            )0x0;
      local_48 = (code *)0x0;
      apcStack_40[0] = (code *)0x0;
      local_58 = (undefined8 *)operator_new(0x20);
      *local_58 = on_storage_moved;
      local_58[1] = 0;
      local_58[2] = _Var6._M_pi;
      local_58[3] = p_Var7;
      apcStack_40[0] =
           ::std::
           _Function_handler<void_(libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_libtorrent::storage_error_&),_std::_Bind<void_(libtorrent::aux::torrent::*(std::shared_ptr<libtorrent::aux::torrent>,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_libtorrent::storage_error_&)>_>
           ::_M_invoke;
      local_48 = ::std::
                 _Function_handler<void_(libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_libtorrent::storage_error_&),_std::_Bind<void_(libtorrent::aux::torrent::*(std::shared_ptr<libtorrent::aux::torrent>,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_libtorrent::storage_error_&)>_>
                 ::_M_manager;
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar8) + 0x30))
                ((long *)CONCAT44(extraout_var,iVar8),uVar4,&local_78,flags);
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,3);
      }
      if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
      }
      if (local_78 != (session_interface *)local_68) {
        operator_delete(local_78,local_68._0_8_ + 1);
      }
      this->field_0x600 = this->field_0x600 | 0x20;
      (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x1f]
      )();
      if ((undefined1 *)local_a8._0_8_ == local_a8 + 0x10) {
        return;
      }
    }
    operator_delete((void *)local_a8._0_8_,CONCAT71(local_a8._17_7_,local_a8[0x10]) + 1);
    return;
  }
  iVar8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [5])();
  if ((*(uint *)(CONCAT44(extraout_var_00,iVar8) + 0x68) & 8) == 0) {
    return;
  }
  iVar8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [5])();
  get_handle((torrent *)local_a8);
  local_88._M_pi._0_4_ = 0x7d;
  local_a9 = unknown;
  alert_manager::
  emplace_alert<libtorrent::storage_moved_failed_alert,libtorrent::torrent_handle,boost::asio::error::basic_errors,char_const(&)[1],libtorrent::operation_t>
            ((alert_manager *)CONCAT44(extraout_var_01,iVar8),(torrent_handle *)local_a8,
             (basic_errors *)&local_88,(char (*) [1])0x3eda7b,&local_a9);
  if ((piece_picker *)local_a8._8_8_ == (piece_picker *)0x0) {
    return;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    piVar1 = (int *)(local_a8._8_8_ + 0xc);
    iVar8 = *piVar1;
    *piVar1 = *piVar1 + -1;
    UNLOCK();
  }
  else {
    iVar8 = *(int *)(local_a8._8_8_ + 0xc);
    *(int *)(local_a8._8_8_ + 0xc) = iVar8 + -1;
  }
  if (iVar8 != 1) {
    return;
  }
  (**(code **)(*(long *)local_a8._8_8_ + 0x18))();
  return;
}

Assistant:

void torrent::move_storage(std::string const& save_path, move_flags_t const flags)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		if (m_abort)
		{
			if (alerts().should_post<storage_moved_failed_alert>())
				alerts().emplace_alert<storage_moved_failed_alert>(get_handle()
					, boost::asio::error::operation_aborted
					, "", operation_t::unknown);
			return;
		}

		// if we don't have metadata yet, we don't know anything about the file
		// structure and we have to assume we don't have any file.
		if (!valid_metadata())
		{
			if (alerts().should_post<storage_moved_alert>())
				alerts().emplace_alert<storage_moved_alert>(get_handle(), save_path, m_save_path);
#if TORRENT_USE_UNC_PATHS
			std::string path = canonicalize_path(save_path);
#else
			std::string const& path = save_path;
#endif
			m_save_path = complete(path);
			return;
		}

		// storage may be nullptr during shutdown
		if (m_storage)
		{
#if TORRENT_USE_UNC_PATHS
			std::string path = canonicalize_path(save_path);
#else
			std::string path = save_path;
#endif
			m_ses.disk_thread().async_move_storage(m_storage, std::move(path), flags
				, std::bind(&torrent::on_storage_moved, shared_from_this(), _1, _2, _3));
			m_moving_storage = true;
			m_ses.deferred_submit_jobs();
		}
		else
		{
			if (alerts().should_post<storage_moved_alert>())
				alerts().emplace_alert<storage_moved_alert>(get_handle(), save_path, m_save_path);

#if TORRENT_USE_UNC_PATHS
			m_save_path = canonicalize_path(save_path);
#else

			m_save_path = save_path;
#endif
			set_need_save_resume(torrent_handle::if_config_changed);
		}
	}